

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

void Curl_setup_transfer(connectdata *conn,int sockindex,curl_off_t size,_Bool getheader,
                        curl_off_t *bytecountp,int writesockindex,curl_off_t *writecountp)

{
  int *piVar1;
  SessionHandle *data;
  curl_socket_t cVar2;
  curl_socket_t cVar3;
  timeval tVar4;
  
  cVar2 = -1;
  cVar3 = -1;
  if (sockindex != -1) {
    cVar3 = conn->sock[sockindex];
  }
  data = conn->data;
  conn->sockfd = cVar3;
  if (writesockindex != -1) {
    cVar2 = conn->sock[writesockindex];
  }
  conn->writesockfd = cVar2;
  (data->req).getheader = getheader;
  (data->req).size = size;
  (data->req).bytecountp = bytecountp;
  (data->req).writebytecountp = writecountp;
  if ((!getheader) &&
     ((((data->req).header = false, size < 1 ||
       (Curl_pgrsSetDownloadSize(data,size), ((data->req).getheader & 1U) == 0)) &&
      ((data->set).opt_no_body != false)))) {
    return;
  }
  if (conn->sockfd != -1) {
    piVar1 = &(data->req).keepon;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  if (conn->writesockfd != -1) {
    if ((data->state).expect100header == true) {
      if (((conn->handler->protocol & 3) != 0) && (*(int *)((long)(data->req).protop + 0x78) == 2))
      {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        tVar4 = curlx_tvnow();
        (data->req).start100 = tVar4;
        Curl_expire(data,(data->set).expect_100_timeout);
        return;
      }
      (data->req).exp100 = EXP100_SENDING_REQUEST;
    }
    piVar1 = &(data->req).keepon;
    *(byte *)piVar1 = (byte)*piVar1 | 2;
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct connectdata *conn, /* connection data */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  curl_off_t *bytecountp,   /* return number of bytes read or NULL */
  int writesockindex,       /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  curl_off_t *writecountp   /* return number of bytes written or NULL */
  )
{
  struct SessionHandle *data;
  struct SingleRequest *k;

  DEBUGASSERT(conn != NULL);

  data = conn->data;
  k = &data->req;

  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  /* now copy all input parameters */
  conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
  conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  k->getheader = getheader;

  k->size = size;
  k->bytecountp = bytecountp;
  k->writebytecountp = writecountp;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->set.opt_no_body) {

    if(conn->sockfd != CURL_SOCKET_BAD)
      k->keepon |= KEEP_RECV;

    if(conn->writesockfd != CURL_SOCKET_BAD) {
      struct HTTP *http = data->req.protop;
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_tvnow();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(conn->writesockfd != CURL_SOCKET_BAD) */
  } /* if(k->getheader || !data->set.opt_no_body) */

}